

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_32x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  uint8_t *puVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar18;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar12 [16];
  ushort uVar22;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar17;
  byte bVar19;
  
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)left;
  auVar12 = psadbw((undefined1  [16])0x0,auVar10);
  uVar11 = auVar12._0_2_ + 4;
  uVar18 = auVar12._2_2_ + 4;
  uVar20 = auVar12._4_2_ + 4;
  uVar21 = auVar12._6_2_ + 4;
  auVar13._0_2_ = uVar11 >> 3;
  uVar22 = uVar21 >> 3;
  uVar1 = CONCAT22((ushort)(auVar12._8_2_ + 4U) >> 3,uVar22);
  auVar14._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar12._10_2_ + 4U) >> 3,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar15._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar12._12_2_ + 4U) >> 3,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar16._0_13_ = auVar5 << 0x30;
  bVar19 = (byte)(uVar21 >> 8);
  auVar16._14_2_ = (undefined2)(CONCAT19(bVar19 >> 3,CONCAT18(bVar19 >> 3,uVar3)) >> 0x40);
  auVar16[0xd] = (char)uVar22;
  bVar19 = (byte)(uVar20 >> 0xb);
  auVar15._12_4_ = (undefined4)(CONCAT37(auVar16._13_3_,CONCAT16((char)uVar22,uVar2)) >> 0x30);
  auVar15[0xb] = bVar19;
  uVar17 = (undefined1)(uVar20 >> 3);
  auVar14._10_6_ = (undefined6)(CONCAT55(auVar15._11_5_,CONCAT14(bVar19,uVar1)) >> 0x20);
  auVar14[9] = uVar17;
  bVar19 = (byte)(uVar18 >> 0xb);
  auVar13._8_8_ = (undefined8)(CONCAT73(auVar14._9_7_,CONCAT12(uVar17,uVar22)) >> 0x10);
  auVar13[7] = bVar19;
  auVar13[6] = bVar19;
  uVar17 = (undefined1)(uVar18 >> 3);
  auVar13[5] = uVar17;
  auVar13[4] = uVar17;
  bVar19 = (byte)(uVar11 >> 8);
  auVar13[3] = bVar19 >> 3;
  auVar13[2] = bVar19 >> 3;
  auVar12[0] = (undefined1)auVar13._0_2_;
  auVar12._2_14_ = auVar13._2_14_;
  auVar12[1] = auVar12[0];
  auVar10 = pshuflw(auVar10,auVar12,0);
  uVar9 = auVar10._0_4_;
  puVar7 = dst + 0x10;
  iVar6 = 8;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    *(undefined4 *)(puVar7 + -0x10) = uVar9;
    *(undefined4 *)(puVar7 + -0xc) = uVar9;
    *(undefined4 *)(puVar7 + -8) = uVar9;
    *(undefined4 *)(puVar7 + -4) = uVar9;
    *(undefined4 *)puVar7 = uVar9;
    *(undefined4 *)(puVar7 + 4) = uVar9;
    *(undefined4 *)(puVar7 + 8) = uVar9;
    *(undefined4 *)(puVar7 + 0xc) = uVar9;
    puVar7 = puVar7 + stride;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_32x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_8(left);
  const __m128i four = _mm_set1_epi16(4);
  sum_left = _mm_add_epi16(sum_left, four);
  sum_left = _mm_srai_epi16(sum_left, 3);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_32xh(&row, 8, dst, stride);
}